

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

void __thiscall
soplex::SLUFactor<double>::solveLeft
          (SLUFactor<double> *this,SSVectorBase<double> *x,VectorBase<double> *y,
          SVectorBase<double> *rhs1,SSVectorBase<double> *rhs2)

{
  int iVar1;
  int iVar2;
  double *vec2;
  int *ridx_00;
  element_type *this_00;
  int *idx;
  double *eps;
  CLUFactor<double> *this_01;
  double *pdVar3;
  SSVectorBase<double> *this_02;
  SSVectorBase<double> *in_RSI;
  long in_RDI;
  int *ridx2;
  double *vec;
  double epsilon;
  int *ridx;
  int rn;
  int *sidx;
  double *svec;
  int n;
  CLUFactor<double> *in_stack_ffffffffffffff08;
  int n_00;
  SSVectorBase<double> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  SVectorBase<double> *in_stack_ffffffffffffff38;
  SSVectorBase<double> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff58;
  
  (**(code **)(**(long **)(in_RDI + 0x388) + 0x18))();
  ridx2 = (int *)(in_RDI + 0x278);
  SSVectorBase<double>::altValues(in_stack_ffffffffffffff10);
  vec2 = (double *)SSVectorBase<double>::altIndexMem(in_stack_ffffffffffffff10);
  iVar1 = SSVectorBase<double>::size((SSVectorBase<double> *)0x28a24a);
  ridx_00 = SSVectorBase<double>::altIndexMem(in_stack_ffffffffffffff10);
  CLUFactor<double>::tolerances(in_stack_ffffffffffffff08);
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x28a28b);
  vec = (double *)Tolerances::epsilon(this_00);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x28a2a8);
  SSVectorBase<double>::clear(in_stack_ffffffffffffff10);
  VectorBase<double>::clear
            ((VectorBase<double> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  SSVectorBase<double>::assign<double>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  iVar2 = SSVectorBase<double>::size((SSVectorBase<double> *)0x28a2fb);
  idx = (int *)(in_RDI + 0x10);
  eps = SSVectorBase<double>::altValues(in_stack_ffffffffffffff10);
  this_01 = (CLUFactor<double> *)SSVectorBase<double>::altIndexMem(in_stack_ffffffffffffff10);
  pdVar3 = VectorBase<double>::get_ptr((VectorBase<double> *)0x28a377);
  n_00 = (int)((ulong)pdVar3 >> 0x20);
  this_02 = (SSVectorBase<double> *)SSVectorBase<double>::altValues(in_stack_ffffffffffffff10);
  iVar1 = CLUFactor<double>::vSolveLeft2
                    (this_01,(double)eps,vec,idx,(double *)CONCAT44(in_stack_ffffffffffffff24,iVar1)
                     ,ridx_00,(int)((ulong)this_02 >> 0x20),vec2,
                     (double *)CONCAT44(iVar2,in_stack_ffffffffffffff58),ridx2,(int)in_RDI);
  SSVectorBase<double>::setSize(this_02,n_00);
  if (0 < iVar1) {
    SSVectorBase<double>::forceSetup(in_RSI);
  }
  SSVectorBase<double>::setSize(this_02,n_00);
  SSVectorBase<double>::forceSetup((SSVectorBase<double> *)(in_RDI + 0x278));
  *(int *)(in_RDI + 0x394) = *(int *)(in_RDI + 0x394) + 2;
  (**(code **)(**(long **)(in_RDI + 0x388) + 0x20))();
  return;
}

Assistant:

void SLUFactor<R>::solveLeft(
   SSVectorBase<R>&       x,
   VectorBase<R>&        y,
   const SVectorBase<R>& rhs1,
   SSVectorBase<R>&       rhs2) //const
{

   solveTime->start();

   int   n;
   R* svec = ssvec.altValues();
   int*  sidx = ssvec.altIndexMem();
   int   rn   = rhs2.size();
   int*  ridx = rhs2.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   ssvec.assign(rhs1);
   n = ssvec.size(); // see altValues();
   n = this->vSolveLeft2(epsilon, x.altValues(), x.altIndexMem(), svec, sidx, n,
                         y.get_ptr(), rhs2.altValues(), ridx, rn);

   // this will unsetup x
   x.setSize(n);

   if(n > 0)
      x.forceSetup();

   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 2;
   solveTime->stop();
}